

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ossl_bio_cf_in_read(BIO *bio,char *buf,int blen)

{
  CURLcode CVar1;
  Curl_easy *local_60;
  CURLcode local_54;
  ulong uStack_50;
  CURLcode result;
  ssize_t nread;
  Curl_easy *data;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  Curl_cfilter *cf;
  char *pcStack_20;
  int blen_local;
  char *buf_local;
  BIO *bio_local;
  
  cf._4_4_ = blen;
  pcStack_20 = buf;
  buf_local = (char *)bio;
  connssl = (ssl_connect_data *)BIO_get_data(bio);
  octx = (ossl_ctx *)(connssl->peer).sni;
  data = (Curl_easy *)octx[1].ssl;
  if (connssl == (ssl_connect_data *)0x0) {
    local_60 = (Curl_easy *)0x0;
  }
  else {
    local_60 = *(Curl_easy **)((connssl->peer).sni + 0x38);
  }
  nread = (ssize_t)local_60;
  local_54 = CURLE_RECV_ERROR;
  if (pcStack_20 == (char *)0x0) {
    bio_local._4_4_ = 0;
  }
  else if ((int)cf._4_4_ < 0) {
    bio_local._4_4_ = 0;
  }
  else {
    uStack_50 = Curl_conn_cf_recv((Curl_cfilter *)(connssl->peer).dispname,local_60,pcStack_20,
                                  (long)(int)cf._4_4_,&local_54);
    if ((((nread != 0) && ((*(ulong *)(nread + 0xa9a) >> 0x1c & 1) != 0)) &&
        ((*(long *)(nread + 0x1320) == 0 || (0 < *(int *)(*(long *)(nread + 0x1320) + 8))))) &&
       ((connssl != (ssl_connect_data *)0x0 && (0 < *(int *)((connssl->peer).hostname + 0xc))))) {
      Curl_trc_cf_infof((Curl_easy *)nread,(Curl_cfilter *)connssl,
                        "ossl_bio_cf_in_read(len=%d) -> %d, err=%d",(ulong)cf._4_4_,
                        uStack_50 & 0xffffffff,(ulong)local_54);
    }
    BIO_clear_flags((BIO *)buf_local,0xf);
    *(CURLcode *)&(data->multi_queue)._list = local_54;
    if ((long)uStack_50 < 0) {
      if (local_54 == CURLE_AGAIN) {
        BIO_set_flags((BIO *)buf_local,9);
      }
    }
    else if (uStack_50 == 0) {
      *(byte *)((long)&octx[2].ssl + 4) = *(byte *)((long)&octx[2].ssl + 4) & 0xfd | 2;
    }
    if (((ulong)(data->multi_queue)._list & 0x10000000000) == 0) {
      CVar1 = Curl_ssl_setup_x509_store
                        ((Curl_cfilter *)connssl,(Curl_easy *)nread,*(SSL_CTX **)data);
      if (CVar1 != CURLE_OK) {
        *(CURLcode *)&(data->multi_queue)._list = CVar1;
        return -1;
      }
      *(byte *)((long)&(data->multi_queue)._list + 5) =
           *(byte *)((long)&(data->multi_queue)._list + 5) & 0xfe | 1;
    }
    bio_local._4_4_ = (int)uStack_50;
  }
  return bio_local._4_4_;
}

Assistant:

static int ossl_bio_cf_in_read(BIO *bio, char *buf, int blen)
{
  struct Curl_cfilter *cf = BIO_get_data(bio);
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nread;
  CURLcode result = CURLE_RECV_ERROR;

  DEBUGASSERT(data);
  /* OpenSSL catches this case, so should we. */
  if(!buf)
    return 0;
  if(blen < 0)
    return 0;

  nread = Curl_conn_cf_recv(cf->next, data, buf, (size_t)blen, &result);
  CURL_TRC_CF(data, cf, "ossl_bio_cf_in_read(len=%d) -> %d, err=%d",
              blen, (int)nread, result);
  BIO_clear_retry_flags(bio);
  octx->io_result = result;
  if(nread < 0) {
    if(CURLE_AGAIN == result)
      BIO_set_retry_read(bio);
  }
  else if(nread == 0) {
    connssl->peer_closed = TRUE;
  }

  /* Before returning server replies to the SSL instance, we need
   * to have setup the x509 store or verification will fail. */
  if(!octx->x509_store_setup) {
    result = Curl_ssl_setup_x509_store(cf, data, octx->ssl_ctx);
    if(result) {
      octx->io_result = result;
      return -1;
    }
    octx->x509_store_setup = TRUE;
  }

  return (int)nread;
}